

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa_hotplug.c
# Opt level: O2

int device_list_size(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  size_t sVar7;
  char *__s;
  int iVar8;
  void *__s_00;
  undefined8 uStack_70;
  char local_68 [8];
  char name [32];
  uint local_40;
  int local_3c;
  int card;
  int dev;
  snd_ctl_t *handle;
  
  uStack_70 = 0x114454;
  lVar6 = snd_ctl_card_info_sizeof();
  lVar6 = -(lVar6 + 0xfU & 0xfffffffffffffff0);
  __s = local_68 + lVar6;
  *(undefined8 *)((long)&uStack_70 + lVar6) = 0x11446a;
  sVar7 = snd_ctl_card_info_sizeof();
  iVar8 = 0;
  name._24_8_ = __s;
  *(undefined8 *)((long)&uStack_70 + lVar6) = 0x11447e;
  memset(__s,0,sVar7);
  *(undefined8 *)((long)&uStack_70 + lVar6) = 0x114483;
  lVar6 = snd_pcm_info_sizeof();
  __s_00 = __s + -(lVar6 + 0xfU & 0xfffffffffffffff0);
  *(undefined8 *)((long)__s_00 + -8) = 0x114499;
  sVar7 = snd_pcm_info_sizeof();
  *(undefined8 *)((long)__s_00 + -8) = 0x1144a6;
  memset(__s_00,0,sVar7);
  local_40 = 0xffffffff;
  *(undefined8 *)((long)__s_00 + -8) = 0x1144b5;
  uVar3 = snd_card_next(&local_40);
  if (-1 < (int)(uVar3 | local_40)) {
    iVar8 = 0;
    do {
      if ((int)local_40 < 0) {
        return iVar8;
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x1144ed;
      sprintf(local_68,"hw:%d");
      *(undefined8 *)((long)__s_00 + -8) = 0x1144fb;
      iVar4 = snd_ctl_open(&card,local_68,0);
      uVar2 = _card;
      uVar1 = name._24_8_;
      if (-1 < iVar4) {
        *(undefined8 *)((long)__s_00 + -8) = 0x114510;
        iVar4 = snd_ctl_card_info(uVar2,uVar1);
        if (-1 < iVar4) {
          local_3c = -1;
          while( true ) {
            uVar1 = _card;
            *(undefined8 *)((long)__s_00 + -8) = 0x114524;
            snd_ctl_pcm_next_device(uVar1,&local_3c);
            if (local_3c < 0) break;
            *(undefined8 *)((long)__s_00 + -8) = 0x114533;
            snd_pcm_info_set_device(__s_00);
            *(undefined8 *)((long)__s_00 + -8) = 0x11453d;
            snd_pcm_info_set_subdevice(__s_00,0);
            *(undefined8 *)((long)__s_00 + -8) = 1;
            uVar1 = *(undefined8 *)((long)__s_00 + -8);
            *(undefined8 *)((long)__s_00 + -8) = 0x114548;
            snd_pcm_info_set_stream(__s_00,uVar1);
            uVar1 = _card;
            *(undefined8 *)((long)__s_00 + -8) = 0x114554;
            uVar3 = snd_ctl_pcm_info(uVar1,__s_00);
            *(undefined8 *)((long)__s_00 + -8) = 0x114561;
            snd_pcm_info_set_stream(__s_00,0);
            uVar1 = _card;
            *(undefined8 *)((long)__s_00 + -8) = 0x11456d;
            uVar5 = snd_ctl_pcm_info(uVar1,__s_00);
            if (-1 < (int)uVar5) {
              *(undefined8 *)((long)__s_00 + -8) = 0x11457b;
              snd_pcm_info_get_subdevices_count(__s_00);
            }
            iVar8 = iVar8 - ((int)~(uVar5 & uVar3) >> 0x1f);
          }
        }
        uVar1 = _card;
        *(undefined8 *)((long)__s_00 + -8) = 0x114591;
        snd_ctl_close(uVar1);
      }
      *(undefined8 *)((long)__s_00 + -8) = 0x11459a;
      iVar4 = snd_card_next(&local_40);
    } while (-1 < iVar4);
  }
  return iVar8;
}

Assistant:

static int device_list_size(void)
{
  snd_ctl_t *handle;
  int card, err, dev, idx;
  int nb = 0;
  snd_ctl_card_info_t *info;
  snd_pcm_info_t *pcminfo;
  snd_ctl_card_info_alloca(&info);
  snd_pcm_info_alloca(&pcminfo);

  card = -1;
  if (snd_card_next(&card) < 0 || card < 0)
  {
    return nb;
  }

  while (card >= 0)
  {
    char name[32];

    sprintf(name, "hw:%d", card);
    if ((err = snd_ctl_open(&handle, name, 0)) < 0)
    {
      goto next_card;
    }
    if ((err = snd_ctl_card_info(handle, info)) < 0)
    {
      snd_ctl_close(handle);
      goto next_card;
    }
    dev = -1;
    while (1)
    {
      unsigned int count;
      int hasPlayback = 0;
      int hasCapture = 0;

      snd_ctl_pcm_next_device(handle, &dev);

      if (dev < 0)
        break;
      snd_pcm_info_set_device(pcminfo, dev);
      snd_pcm_info_set_subdevice(pcminfo, 0);
      snd_pcm_info_set_stream(pcminfo, SND_PCM_STREAM_CAPTURE);
      if ((err = snd_ctl_pcm_info(handle, pcminfo)) >= 0)
      {
        hasCapture = 1;
      }

      snd_pcm_info_set_stream(pcminfo, SND_PCM_STREAM_PLAYBACK);
      if ((err = snd_ctl_pcm_info(handle, pcminfo)) >= 0)
      {
        hasPlayback = 1;

        count = snd_pcm_info_get_subdevices_count(pcminfo);
      }

      if(hasPlayback == 0 && hasCapture == 0)
        continue;

      nb++;
    }
    snd_ctl_close(handle);
next_card:
    if (snd_card_next(&card) < 0)
    {
      break;
    }
  }
  return nb;
}